

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::startsWith(string *s,string *prefix)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  uVar1 = s->_M_string_length;
  uVar2 = prefix->_M_string_length;
  if (uVar1 < uVar2) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)s);
    if (local_48 == prefix->_M_string_length) {
      if (local_48 == 0) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp(local_50,(prefix->_M_dataplus)._M_p,local_48);
        bVar4 = iVar3 == 0;
      }
    }
  }
  if ((uVar2 <= uVar1) && (local_50 != local_40)) {
    operator_delete(local_50);
  }
  return bVar4;
}

Assistant:

bool startsWith(std::string const& s, std::string const& prefix) {
		return s.size() >= prefix.size() && s.substr(0, prefix.size()) == prefix;
	}